

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  Rep *pRVar1;
  Nonnull<const_char_*> pcVar2;
  int unaff_EBP;
  long in_RSI;
  
  if (this->tagged_rep_or_elem_ == (void *)0x0) {
    Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              ((RepeatedPtrFieldBase *)&stack0xffffffffffffffe0);
  }
  else {
    if (this->arena_ != (Arena *)0x0) {
      return;
    }
    unaff_EBP = 1;
    if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
      pRVar1 = rep(this);
      unaff_EBP = pRVar1->allocated_size;
    }
    in_RSI = (long)this->capacity_proxy_ + 1;
    if (unaff_EBP <= (int)in_RSI) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
      goto LAB_00438fb2;
    }
  }
  pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                     ((long)unaff_EBP,in_RSI,"n <= Capacity()");
LAB_00438fb2:
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>();
    return;
  }
  Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>();
}

Assistant:

inline bool NeedsDestroy() const {
    // Either there is an allocated element in SSO buffer or there is an
    // allocated Rep.
    return tagged_rep_or_elem_ != nullptr;
  }